

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plutovg-stb-image.h
# Opt level: O2

stbi__uint16 * stbi__convert_format16(stbi__uint16 *data,int img_n,int req_comp,uint x,uint y)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  stbi__uint16 *psVar4;
  int iVar5;
  long lVar6;
  ulong uVar7;
  ulong uVar8;
  stbi__uint16 *psVar9;
  stbi__uint16 *psVar10;
  long in_FS_OFFSET;
  undefined1 auVar11 [16];
  
  psVar4 = (stbi__uint16 *)malloc((ulong)(req_comp * x * 8));
  if (psVar4 == (stbi__uint16 *)0x0) {
    free(data);
    *(char **)(in_FS_OFFSET + -8) = "outofmem";
  }
  else {
    uVar3 = 0;
    if ((int)x < 1) {
      x = 0;
    }
    iVar2 = img_n * 8;
    iVar1 = req_comp + -1;
    uVar7 = 0;
    for (uVar8 = 0; uVar8 != x; uVar8 = uVar8 + 1) {
      if (iVar2 == 0x18) {
        iVar5 = (int)uVar8 * req_comp;
        psVar9 = data + (uint)(iVar5 * img_n);
        psVar10 = psVar4 + (uint)(iVar5 * 4);
        for (iVar5 = iVar1; -1 < iVar5; iVar5 = iVar5 + -1) {
          *(undefined4 *)psVar10 = *(undefined4 *)psVar9;
          psVar10[2] = psVar9[2];
          psVar10[3] = 0xffff;
          psVar9 = psVar9 + 3;
          psVar10 = psVar10 + 4;
        }
      }
      else if (iVar2 == 0x10) {
        lVar6 = 0;
        for (iVar5 = iVar1; -1 < iVar5; iVar5 = iVar5 + -1) {
          auVar11 = ZEXT416(*(uint *)((long)data + lVar6 + uVar7 * 2));
          auVar11 = pshuflw(auVar11,auVar11,0x40);
          *(long *)(psVar4 + (ulong)uVar3 + lVar6) = auVar11._0_8_;
          lVar6 = lVar6 + 4;
        }
      }
      else {
        if (iVar2 != 8) {
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_c_cmakelists/sammycage[P]lunasvg/plutovg/source/plutovg-stb-image.h"
                        ,0x737,
                        "stbi__uint16 *stbi__convert_format16(stbi__uint16 *, int, int, unsigned int, unsigned int)"
                       );
        }
        lVar6 = 0;
        for (iVar5 = iVar1; -1 < iVar5; iVar5 = iVar5 + -1) {
          auVar11._8_8_ = 0;
          auVar11._0_8_ = (ulong)*(ushort *)((long)data + lVar6 + uVar7 * 2) | 0xffff0000;
          auVar11 = pshuflw(auVar11,auVar11,0x40);
          *(long *)(psVar4 + (ulong)uVar3 + lVar6 * 2) = auVar11._0_8_;
          lVar6 = lVar6 + 2;
        }
      }
      uVar7 = (ulong)(uint)((int)uVar7 + req_comp * img_n);
      uVar3 = uVar3 + req_comp * 4;
    }
    free(data);
  }
  return psVar4;
}

Assistant:

static stbi__uint16 *stbi__convert_format16(stbi__uint16 *data, int img_n, int req_comp, unsigned int x, unsigned int y)
{
   int i,j;
   stbi__uint16 *good;

   if (req_comp == img_n) return data;
   STBI_ASSERT(req_comp >= 1 && req_comp <= 4);

   good = (stbi__uint16 *) stbi__malloc(req_comp * x * y * 2);
   if (good == NULL) {
      STBI_FREE(data);
      return (stbi__uint16 *) stbi__errpuc("outofmem", "Out of memory");
   }

   for (j=0; j < (int) y; ++j) {
      stbi__uint16 *src  = data + j * x * img_n   ;
      stbi__uint16 *dest = good + j * x * req_comp;

      #define STBI__COMBO(a,b)  ((a)*8+(b))
      #define STBI__CASE(a,b)   case STBI__COMBO(a,b): for(i=x-1; i >= 0; --i, src += a, dest += b)
      // convert source image with img_n components to one with req_comp components;
      // avoid switch per pixel, so use switch per scanline and massive macros
      switch (STBI__COMBO(img_n, req_comp)) {
         STBI__CASE(1,2) { dest[0]=src[0]; dest[1]=0xffff;                                     } break;
         STBI__CASE(1,3) { dest[0]=dest[1]=dest[2]=src[0];                                     } break;
         STBI__CASE(1,4) { dest[0]=dest[1]=dest[2]=src[0]; dest[3]=0xffff;                     } break;
         STBI__CASE(2,1) { dest[0]=src[0];                                                     } break;
         STBI__CASE(2,3) { dest[0]=dest[1]=dest[2]=src[0];                                     } break;
         STBI__CASE(2,4) { dest[0]=dest[1]=dest[2]=src[0]; dest[3]=src[1];                     } break;
         STBI__CASE(3,4) { dest[0]=src[0];dest[1]=src[1];dest[2]=src[2];dest[3]=0xffff;        } break;
         STBI__CASE(3,1) { dest[0]=stbi__compute_y_16(src[0],src[1],src[2]);                   } break;
         STBI__CASE(3,2) { dest[0]=stbi__compute_y_16(src[0],src[1],src[2]); dest[1] = 0xffff; } break;
         STBI__CASE(4,1) { dest[0]=stbi__compute_y_16(src[0],src[1],src[2]);                   } break;
         STBI__CASE(4,2) { dest[0]=stbi__compute_y_16(src[0],src[1],src[2]); dest[1] = src[3]; } break;
         STBI__CASE(4,3) { dest[0]=src[0];dest[1]=src[1];dest[2]=src[2];                       } break;
         default: STBI_ASSERT(0); STBI_FREE(data); STBI_FREE(good); return (stbi__uint16*) stbi__errpuc("unsupported", "Unsupported format conversion");
      }
      #undef STBI__CASE
   }

   STBI_FREE(data);
   return good;
}